

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_b16c(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (in->a < 1) {
    iVar1 = back->ig;
    out->r = back->ir;
    out->g = iVar1;
    uVar2 = back->ib;
  }
  else {
    dVar4 = (double)in->a / 65535.0;
    dVar5 = 1.0 - dVar4;
    dVar4 = dVar4 / 65535.0;
    dVar3 = (double)in->r * dVar4 + back->dr * dVar5;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    out->r = (int)dVar3 & 0xff;
    dVar3 = (double)in->g * dVar4 + back->dg * dVar5;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    out->g = (int)dVar3 & 0xff;
    dVar3 = (double)in->b * dVar4 + dVar5 * back->db;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    uVar2 = (int)dVar3 & 0xff;
  }
  out->b = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_b16c(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else
   {
      double a = in->a/65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = sRGB(in->r * a + back->dr * a1);
      out->g = sRGB(in->g * a + back->dg * a1);
      out->b = sRGB(in->b * a + back->db * a1);
   }

   out->a = 255;
}